

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::PrimitiveInstantiationSyntax::PrimitiveInstantiationSyntax
          (PrimitiveInstantiationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token type,
          NetStrengthSyntax *strength,TimingControlSyntax *delay,
          SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *instances,Token semi)

{
  Token TVar1;
  bool bVar2;
  HierarchicalInstanceSyntax *pHVar3;
  undefined8 uVar4;
  HierarchicalInstanceSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *__range2;
  TimingControlSyntax *delay_local;
  NetStrengthSyntax *strength_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  PrimitiveInstantiationSyntax *this_local;
  Token type_local;
  
  TVar1 = semi;
  uVar4 = type._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,PrimitiveInstantiation,attributes);
  (this->type).kind = (short)uVar4;
  (this->type).field_0x2 = (char)((ulong)uVar4 >> 0x10);
  (this->type).numFlags = (NumericTokenFlags)(char)((ulong)uVar4 >> 0x18);
  (this->type).rawLen = (int)((ulong)uVar4 >> 0x20);
  (this->type).info = type.info;
  this->strength = strength;
  this->delay = delay;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::SeparatedSyntaxList
            (&this->instances,instances);
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  semi.info = TVar1.info;
  (this->semi).info = semi.info;
  if (this->strength != (NetStrengthSyntax *)0x0) {
    (this->strength->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  if (this->delay != (TimingControlSyntax *)0x0) {
    (this->delay->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->instances).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::begin(&this->instances);
  _child = SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::end(&this->instances);
  while( true ) {
    bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::HierarchicalInstanceSyntax_*,_unsigned_long,_slang::syntax::HierarchicalInstanceSyntax_**,_slang::syntax::HierarchicalInstanceSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::HierarchicalInstanceSyntax_*,_unsigned_long,_slang::syntax::HierarchicalInstanceSyntax_**,_slang::syntax::HierarchicalInstanceSyntax_*&>
                          *)&__end2.index,
                         (iterator_base<slang::syntax::HierarchicalInstanceSyntax_*> *)&child);
    if (!bVar2) break;
    pHVar3 = SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::
             iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>::operator*
                       ((iterator_base<slang::syntax::HierarchicalInstanceSyntax_*> *)&__end2.index)
    ;
    (pHVar3->super_SyntaxNode).parent = (SyntaxNode *)this;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::HierarchicalInstanceSyntax_*,_unsigned_long,_slang::syntax::HierarchicalInstanceSyntax_**,_slang::syntax::HierarchicalInstanceSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::HierarchicalInstanceSyntax_*,_unsigned_long,_slang::syntax::HierarchicalInstanceSyntax_**,_slang::syntax::HierarchicalInstanceSyntax_*&>
                  *)&__end2.index);
  }
  return;
}

Assistant:

PrimitiveInstantiationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token type, NetStrengthSyntax* strength, TimingControlSyntax* delay, const SeparatedSyntaxList<HierarchicalInstanceSyntax>& instances, Token semi) :
        MemberSyntax(SyntaxKind::PrimitiveInstantiation, attributes), type(type), strength(strength), delay(delay), instances(instances), semi(semi) {
        if (this->strength) this->strength->parent = this;
        if (this->delay) this->delay->parent = this;
        this->instances.parent = this;
        for (auto child : this->instances)
            child->parent = this;
    }